

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

Expression __thiscall cnn::Cluster::get_bias(Cluster *this,ComputationGraph *cg)

{
  float *in_RDX;
  undefined8 extraout_RDX;
  Parameters *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  Expression *in_stack_ffffffffffffffb8;
  ComputationGraph *this_00;
  ComputationGraph *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  if ((in_RSI->g).v != in_RDX) {
    cnn::expr::parameter(in_stack_ffffffffffffffd8,in_RSI);
    cnn::expr::Expression::operator=((Expression *)this_00,in_stack_ffffffffffffffb8);
  }
  cnn::expr::Expression::Expression((Expression *)this_00,in_stack_ffffffffffffffb8);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression Cluster::get_bias(ComputationGraph& cg) const {
  if (bias.pg != &cg) {
    bias = parameter(cg, p_bias);
  }
  return bias;
}